

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O1

void __thiscall Restaurant::goBackup(Restaurant *this)

{
  pointer *pppBVar1;
  iterator __position;
  BaseAction *this_00;
  BaseAction *local_18;
  
  this_00 = (BaseAction *)operator_new(0x30);
  BackupRestaurant::BackupRestaurant((BackupRestaurant *)this_00);
  __position._M_current =
       (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = this_00;
  if (__position._M_current ==
      (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<BaseAction*,std::allocator<BaseAction*>>::_M_realloc_insert<BaseAction*>
              ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,__position,
               &local_18);
  }
  else {
    *__position._M_current = this_00;
    pppBVar1 = &(this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  (**this_00->_vptr_BaseAction)(this_00,this);
  return;
}

Assistant:

void Restaurant::goBackup()
{
    auto * newBackup = new BackupRestaurant();
    actionsLog.push_back(newBackup);
    newBackup->act(*this);
}